

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O1

void __thiscall VarnodeBank::replace(VarnodeBank *this,Varnode *oldvn,Varnode *newvn)

{
  size_t *psVar1;
  byte *pbVar2;
  uint4 *puVar3;
  _List_node_base *p_Var4;
  PcodeOp *op;
  pointer ppVVar5;
  _List_node_base *p_Var6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  _Self __tmp;
  
  p_Var4 = (oldvn->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  do {
    do {
      p_Var6 = p_Var4;
      if (p_Var6 == (_List_node_base *)&oldvn->descend) {
        pbVar2 = (byte *)((long)&oldvn->flags + 3);
        *pbVar2 = *pbVar2 | 2;
        if (oldvn->high != (HighVariable *)0x0) {
          puVar3 = &oldvn->high->highflags;
          *(byte *)puVar3 = (byte)*puVar3 | 5;
        }
        pbVar2 = (byte *)((long)&newvn->flags + 3);
        *pbVar2 = *pbVar2 | 2;
        if (newvn->high != (HighVariable *)0x0) {
          puVar3 = &newvn->high->highflags;
          *(byte *)puVar3 = (byte)*puVar3 | 5;
        }
        return;
      }
      p_Var4 = p_Var6->_M_next;
      op = (PcodeOp *)p_Var6[1]._M_next;
    } while (op->output == newvn);
    ppVVar5 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar8 = (ulong)((long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar5) >> 3;
    uVar7 = (uint)uVar8;
    if ((int)uVar7 < 1) {
      lVar11 = 0;
    }
    else {
      uVar9 = 0;
      do {
        uVar10 = uVar9;
        if (ppVVar5[uVar9] == oldvn) break;
        uVar9 = uVar9 + 1;
        uVar10 = uVar8;
      } while ((uVar7 & 0x7fffffff) != uVar9);
      lVar11 = (long)(int)uVar10;
    }
    psVar1 = &(oldvn->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var6);
    (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
    super__Vector_impl_data._M_start[lVar11] = (Varnode *)0x0;
    Varnode::addDescend(newvn,op);
    (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
    super__Vector_impl_data._M_start[lVar11] = newvn;
  } while( true );
}

Assistant:

void VarnodeBank::replace(Varnode *oldvn,Varnode *newvn)

{
  list<PcodeOp *>::iterator iter,tmpiter;
  PcodeOp *op;
  int4 i;

  iter = oldvn->descend.begin();
  while(iter!=oldvn->descend.end()) {
    op = *iter;
    tmpiter = iter++;
    if (op->output == newvn) continue; // Cannot be input to your own definition
    i = op->getSlot(oldvn);
    oldvn->descend.erase(tmpiter);	// Sever the link fully
    op->clearInput(i); // Before attempting to build the new link
    newvn->addDescend(op);
    op->setInput(newvn,i); // This must be called AFTER descend is updated
  }
  oldvn->setFlags(Varnode::coverdirty);
  newvn->setFlags(Varnode::coverdirty);
}